

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getRelativeTransform
          (KinDynComputations *this,string *refFrameName,string *frameName,
          MatrixView<double> *refFrame_H_frame)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  MatrixView<double> local_60;
  
  uVar2 = iDynTree::Model::getFrameIndex((string *)&this->pimpl->m_robot_model);
  iDynTree::reportErrorIf
            ((bool)((byte)(uVar2 >> 0x1f) & 1),"KinDynComputations::getFrameIndex",
             "requested frameName not found in model");
  uVar3 = iDynTree::Model::getFrameIndex((string *)&this->pimpl->m_robot_model);
  iDynTree::reportErrorIf
            ((bool)((byte)(uVar3 >> 0x1f) & 1),"KinDynComputations::getFrameIndex",
             "requested frameName not found in model");
  if (FRAME_INVALID_INDEX == (int)uVar3) {
    pcVar4 = "unknown frameName";
  }
  else {
    if (FRAME_INVALID_INDEX != (int)uVar2) {
      local_60.m_storage = refFrame_H_frame->m_storage;
      local_60.m_rows = refFrame_H_frame->m_rows;
      local_60.m_cols = refFrame_H_frame->m_cols;
      local_60.m_storageOrder = refFrame_H_frame->m_storageOrder;
      local_60.m_innerStride = refFrame_H_frame->m_innerStride;
      local_60.m_outerStride = refFrame_H_frame->m_outerStride;
      bVar1 = getRelativeTransform(this,(long)(int)uVar2,(long)(int)uVar3,&local_60);
      return bVar1;
    }
    pcVar4 = "unknown refFrameName";
  }
  iDynTree::reportError("KinDynComputations","getRelativeTransform",pcVar4);
  return false;
}

Assistant:

bool KinDynComputations::getRelativeTransform(const std::string & refFrameName,
                                              const std::string & frameName,
                                              iDynTree::MatrixView<double> refFrame_H_frame)
{
    const int refFrameIndex = getFrameIndex(refFrameName);
    const int frameIndex = getFrameIndex(frameName);
    if( frameIndex == iDynTree::FRAME_INVALID_INDEX )
    {
        reportError("KinDynComputations","getRelativeTransform","unknown frameName");
        return false;
    }
    else if( refFrameIndex == iDynTree::FRAME_INVALID_INDEX )
    {
        reportError("KinDynComputations","getRelativeTransform","unknown refFrameName");
        return false;
    }
    else
    {
        return this->getRelativeTransform(refFrameIndex,frameIndex, refFrame_H_frame);
    }
}